

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

bool __thiscall SimpleLoggerMgr::chkExitOnCrash(SimpleLoggerMgr *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  string env_segv_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  bVar2 = true;
  if (this->exitOnCrash == false) {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    pcVar3 = getenv("SIMPLELOGGER_EXIT_ON_CRASH");
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&local_28);
    }
    bVar1 = std::operator==(&local_28,"ON");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==(&local_28,"on");
      if (!bVar1) {
        bVar1 = std::operator==(&local_28,"TRUE");
        if (!bVar1) {
          bVar2 = std::operator==(&local_28,"true");
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  return bVar2;
}

Assistant:

bool SimpleLoggerMgr::chkExitOnCrash() {
    if (exitOnCrash) return true;

    std::string env_segv_str;
    const char* env_segv = std::getenv("SIMPLELOGGER_EXIT_ON_CRASH");
    if (env_segv) env_segv_str = env_segv;

    if ( env_segv_str == "ON" ||
         env_segv_str == "on" ||
         env_segv_str == "TRUE" ||
         env_segv_str == "true" ) {
        // Manually turned off by user, via env var.
        return true;
    }

    return false;
}